

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::Parser::SkipRestOfBlock(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  
  do {
    TVar1 = (this->input_->current_).type;
    if (TVar1 == TYPE_SYMBOL) {
      bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
      if (bVar2) {
        return;
      }
      bVar2 = TryConsume(this,"{");
      if (bVar2) {
        SkipRestOfBlock(this);
      }
    }
    else if (TVar1 == TYPE_END) {
      return;
    }
    io::Tokenizer::Next(this->input_);
  } while( true );
}

Assistant:

void Parser::SkipRestOfBlock() {
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration("}", NULL)) {
        return;
      } else if (TryConsume("{")) {
        SkipRestOfBlock();
      }
    }
    input_->Next();
  }
}